

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_list.c
# Opt level: O3

opj_procedure_list_t * opj_procedure_list_create(void)

{
  opj_procedure_list_t *__ptr;
  opj_procedure *ppvVar1;
  
  __ptr = (opj_procedure_list_t *)calloc(1,0x10);
  if (__ptr != (opj_procedure_list_t *)0x0) {
    __ptr->m_nb_max_procedures = 10;
    ppvVar1 = (opj_procedure *)calloc(1,0x50);
    __ptr->m_procedures = ppvVar1;
    if (ppvVar1 != (opj_procedure *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (opj_procedure_list_t *)0x0;
}

Assistant:

opj_procedure_list_t *  opj_procedure_list_create()
{
	/* memory allocation */
	opj_procedure_list_t * l_validation = (opj_procedure_list_t *) opj_malloc(sizeof(opj_procedure_list_t));
	if
		(! l_validation)
	{
		return 00;
	}
	/* initialization */
	memset(l_validation,0,sizeof(opj_procedure_list_t));
	l_validation->m_nb_max_procedures = OPJ_VALIDATION_SIZE;
	l_validation->m_procedures = (void**)opj_malloc(
		OPJ_VALIDATION_SIZE * sizeof(opj_procedure));
	if
		(! l_validation->m_procedures)
	{
		opj_free(l_validation);
		return 00;
	}
	memset(l_validation->m_procedures,0,OPJ_VALIDATION_SIZE * sizeof(opj_procedure));
	return l_validation;
}